

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O1

SPIREntryPoint * __thiscall
spirv_cross::Compiler::get_entry_point(Compiler *this,string *name,ExecutionModel model)

{
  int iVar1;
  runtime_error *this_00;
  _Hash_node_base *p_Var2;
  bool bVar3;
  undefined1 *local_118;
  undefined1 local_110 [136];
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_88;
  ExecutionModel local_38;
  
  p_Var2 = (this->ir).entry_points._M_h._M_before_begin._M_nxt;
  if (p_Var2 != (_Hash_node_base *)0x0) {
    do {
      local_118 = (undefined1 *)CONCAT44(local_118._4_4_,*(undefined4 *)&p_Var2[1]._M_nxt);
      SPIREntryPoint::SPIREntryPoint((SPIREntryPoint *)local_110,(SPIREntryPoint *)(p_Var2 + 2));
      if (local_110._48_8_ == name->_M_string_length) {
        if (local_110._48_8_ != 0) {
          iVar1 = bcmp((void *)local_110._40_8_,(name->_M_dataplus)._M_p,local_110._48_8_);
          if (iVar1 != 0) goto LAB_002beba4;
        }
        bVar3 = local_38 == model;
      }
      else {
LAB_002beba4:
        bVar3 = false;
      }
      ::std::
      _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::~_Hashtable(&local_88);
      local_110._80_8_ = 0;
      if ((TypedID<(spirv_cross::Types)2> *)local_110._72_8_ !=
          (TypedID<(spirv_cross::Types)2> *)(local_110 + 0x60)) {
        free((void *)local_110._72_8_);
      }
      if ((undefined1 *)local_110._40_8_ != local_110 + 0x38) {
        operator_delete((void *)local_110._40_8_);
      }
      if ((undefined1 *)local_110._8_8_ != local_110 + 0x18) {
        operator_delete((void *)local_110._8_8_);
      }
    } while ((!bVar3) && (p_Var2 = p_Var2->_M_nxt, p_Var2 != (_Hash_node_base *)0x0));
  }
  if (p_Var2 != (_Hash_node_base *)0x0) {
    return (SPIREntryPoint *)(p_Var2 + 2);
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_118 = local_110 + 8;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_118,"Entry point does not exist.","");
  ::std::runtime_error::runtime_error(this_00,(string *)&local_118);
  *(undefined ***)this_00 = &PTR__runtime_error_0035b0b8;
  __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

SPIREntryPoint &Compiler::get_entry_point(const std::string &name, ExecutionModel model)
{
	auto itr = find_if(begin(ir.entry_points), end(ir.entry_points),
	                   [&](const std::pair<uint32_t, SPIREntryPoint> &entry) -> bool {
		                   return entry.second.orig_name == name && entry.second.model == model;
	                   });

	if (itr == end(ir.entry_points))
		SPIRV_CROSS_THROW("Entry point does not exist.");

	return itr->second;
}